

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2612_write(void *chip,UINT8 a,UINT8 v)

{
  byte bVar1;
  uint uVar2;
  
  switch(a & 3) {
  case 0:
    *(UINT8 *)((long)chip + 0x22c) = v;
    *(undefined1 *)((long)chip + 0x5108) = 0;
    break;
  case 1:
    if (*(char *)((long)chip + 0x5108) == '\0') {
      bVar1 = *(byte *)((long)chip + 0x22c);
      *(UINT8 *)((long)chip + (ulong)bVar1 + 8) = v;
      if ((bVar1 & 0xf0) != 0x20) {
        ym2612_update_req(chip);
        uVar2 = (uint)bVar1;
        goto LAB_001285a6;
      }
      uVar2 = (uint)bVar1;
      if (uVar2 == 0x2c) {
        *(byte *)((long)chip + 0x510a) = v & 0x20;
        *(uint *)((long)chip + 0x510c) =
             (uint)(v >> 3 & 1) | *(uint *)((long)chip + 0x510c) & 0xfffffffe;
      }
      else if (uVar2 == 0x2b) {
        *(byte *)((long)chip + 0x5109) = v & 0x80;
      }
      else {
        if (uVar2 != 0x2a) {
          ym2612_update_req(chip);
          OPNWriteMode((FM_OPN *)((long)chip + 0x208),uVar2,(uint)v);
          return;
        }
        *(uint *)((long)chip + 0x510c) = (*(uint *)((long)chip + 0x510c) & 1) + (uint)v * 2 + -0x100
        ;
      }
    }
    break;
  case 2:
    *(UINT8 *)((long)chip + 0x22c) = v;
    *(undefined1 *)((long)chip + 0x5108) = 1;
    break;
  case 3:
    if (*(char *)((long)chip + 0x5108) == '\x01') {
      ym2612_update_req(chip);
      bVar1 = *(byte *)((long)chip + 0x22c);
      *(UINT8 *)((long)chip + (ulong)bVar1 + 0x108) = v;
      uVar2 = bVar1 | 0x100;
LAB_001285a6:
      OPNWriteReg((FM_OPN *)((long)chip + 0x208),uVar2,(uint)v);
      return;
    }
  }
  return;
}

Assistant:

void ym2612_write(void *chip, UINT8 a, UINT8 v)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN *OPN   = &F2612->OPN;
	int addr;

	//v &= 0xff;  /* adjust to 8 bit bus */

	switch( a&3 )
	{
	case 0: /* address port 0 */
		OPN->ST.address = v;
		F2612->addr_A1 = 0;
		break;

	case 1: /* data port 0    */
		if (F2612->addr_A1 != 0)
			break;  /* verified on real YM2608 */

		addr = OPN->ST.address;
		F2612->REGS[addr] = v;
		switch(addr & 0xf0)
		{
		case 0x20:  /* 0x20-0x2f Mode */
			switch( addr )
			{
			case 0x2a:  /* DAC data (YM2612) */
				//ym2612_update_req(F2612);
				F2612->dacout &= 0x01;
				// set high 8 bit of the 9-bit DAC
				F2612->dacout |= ((int)v - 0x80) << 1;   /* level unknown */
				break;
			case 0x2b:  /* DAC Sel  (YM2612) */
				/* b7 = dac enable */
				F2612->dacen = v & 0x80;
				break;
			case 0x2C:  // undocumented: DAC Test Register
				// http://gendev.spritesmind.net/forum/viewtopic.php?p=26996#p26996
				// b7/b6/b4 = various test bits
				// b5 = makes DAC go to channels 0..3 and 5.
				// b3 = 9th DAC bit
				F2612->dac_test = v & 0x20;
				F2612->dacout &= ~0x01;
				// set DAC's 9th bit
				F2612->dacout |= (v & 0x08) >> 3;
				break;
			default:    /* OPN section */
				ym2612_update_req(F2612);
				/* write register */
				OPNWriteMode(OPN,addr,v);
			}
			break;
		default:    /* 0x30-0xff OPN section */
			ym2612_update_req(F2612);
			/* write register */
			OPNWriteReg(OPN,addr,v);
		}
		break;

	case 2: /* address port 1 */
		OPN->ST.address = v;
		F2612->addr_A1 = 1;
		break;

	case 3: /* data port 1    */
		if (F2612->addr_A1 != 1)
			break;  /* verified on real YM2608 */

		ym2612_update_req(F2612);
		addr = OPN->ST.address;
		F2612->REGS[addr | 0x100] = v;
		OPNWriteReg(OPN,addr | 0x100,v);
		break;
	}
	//return OPN->ST.irq;
	return;
}